

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O2

VW_HANDLE VW_InitializeA(char *pstrArgs)

{
  vw *pvVar1;
  string s;
  allocator local_49;
  string local_48;
  string local_28 [32];
  
  std::__cxx11::string::string(local_28,pstrArgs,&local_49);
  std::__cxx11::string::string((string *)&local_48,local_28);
  pvVar1 = VW::initialize(&local_48,(io_buf *)0x0,false,(trace_message_t)0x0,(void *)0x0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_28);
  return pvVar1;
}

Assistant:

VW_DLL_MEMBER VW_HANDLE VW_CALLING_CONV VW_InitializeA(const char * pstrArgs)
{ string s(pstrArgs);
  vw* all = VW::initialize(s);
  return static_cast<VW_HANDLE>(all);
}